

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall cmCPackGenerator::Initialize(cmCPackGenerator *this,string *name,cmMakefile *mf)

{
  cmMakefile *this_00;
  bool bVar1;
  string *filename;
  allocator<char> local_b1;
  string local_b0;
  int local_90;
  allocator<char> local_89;
  int result;
  cmValue local_68;
  cmValue config;
  allocator<char> local_49;
  string local_48;
  cmMakefile *local_28;
  cmMakefile *mf_local;
  string *name_local;
  cmCPackGenerator *this_local;
  
  this->MakefileMap = mf;
  local_28 = mf;
  mf_local = (cmMakefile *)name;
  name_local = (string *)this;
  std::__cxx11::string::operator=((string *)&this->Name,(string *)name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CPACK_GENERATOR",&local_49);
  SetOption(this,&local_48,&this->Name);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"CPACK_PROJECT_CONFIG_FILE",&local_89);
  local_68 = GetOption(this,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  std::allocator<char>::~allocator(&local_89);
  bVar1 = cmValue::operator_cast_to_bool(&local_68);
  this_00 = local_28;
  if (bVar1) {
    filename = cmValue::operator_cast_to_string_(&local_68);
    cmMakefile::ReadListFile(this_00,filename);
  }
  local_90 = (*this->_vptr_cmCPackGenerator[0xf])();
  bVar1 = cmSystemTools::GetErrorOccurredFlag();
  if (bVar1) {
    this_local._4_4_ = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"CPACK_PACKAGING_INSTALL_PREFIX",&local_b1);
    SetOptionIfNotSet(this,&local_b0,"/");
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    this_local._4_4_ = local_90;
  }
  return this_local._4_4_;
}

Assistant:

int cmCPackGenerator::Initialize(const std::string& name, cmMakefile* mf)
{
  this->MakefileMap = mf;
  this->Name = name;
  // set the running generator name
  this->SetOption("CPACK_GENERATOR", this->Name);
  // Load the project specific config file
  cmValue config = this->GetOption("CPACK_PROJECT_CONFIG_FILE");
  if (config) {
    mf->ReadListFile(config);
  }
  int result = this->InitializeInternal();
  if (cmSystemTools::GetErrorOccurredFlag()) {
    return 0;
  }

  // If a generator subclass did not already set this option in its
  // InitializeInternal implementation, and the project did not already set
  // it, the default value should be:
  this->SetOptionIfNotSet("CPACK_PACKAGING_INSTALL_PREFIX", "/");

  return result;
}